

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O2

FILE * Minisat::open_pipe(char *fmt,char *path,char *mode)

{
  bool bVar1;
  char *__dest;
  size_t sVar2;
  FILE *pFVar3;
  size_t sVar4;
  
  for (sVar4 = 0; (fmt[sVar4] & 0xdfU) != 0; sVar4 = sVar4 + 1) {
  }
  pFVar3 = (FILE *)0x0;
  __dest = (char *)xrealloc((void *)0x0,sVar4 + 1);
  if (__dest != (char *)0x0) {
    strncpy(__dest,fmt,sVar4);
    __dest[sVar4] = '\0';
    bVar1 = find_executable(__dest);
    if (bVar1) {
      free(__dest);
      sVar4 = strlen(fmt);
      sVar2 = strlen(path);
      __dest = (char *)xrealloc((void *)0x0,sVar4 + sVar2 + 1);
      if (__dest == (char *)0x0) {
        return (FILE *)0x0;
      }
      sprintf(__dest,fmt,path);
      pFVar3 = popen(__dest,mode);
    }
    else {
      pFVar3 = (FILE *)0x0;
      fprintf(_stderr,"c WARNING: failed to find executable %s\n",__dest);
    }
    free(__dest);
  }
  return (FILE *)pFVar3;
}

Assistant:

inline FILE *open_pipe(const char *fmt, const char *path, const char *mode)
{
    size_t name_len = 0;
    while (fmt[name_len] && fmt[name_len] != ' ') name_len++;
    char *name = (char *)xrealloc(NULL, name_len + 1);
    if (!name) return 0;
    strncpy(name, fmt, name_len);
    name[name_len] = 0;
    bool found = find_executable(name);
    if (!found) fprintf(stderr, "c WARNING: failed to find executable %s\n", name);
    free(name);
    if (!found) return 0;
    char *cmd = (char *)xrealloc(NULL, strlen(fmt) + strlen(path) + 1);
    if (!cmd) return 0;
    sprintf(cmd, fmt, path);
    FILE *res = popen(cmd, mode);
    free(cmd);
    return res;
}